

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O0

QIcon __thiscall
QCommonStylePrivate::iconFromMacTheme
          (QCommonStylePrivate *this,StandardPixmap standardIcon,QStyleOption *option,
          QWidget *widget)

{
  QIconPrivate *in_RDI;
  
  QIcon::QIcon((QIcon *)in_RDI);
  return (QIcon)in_RDI;
}

Assistant:

QIcon QCommonStylePrivate::iconFromMacTheme(QCommonStyle::StandardPixmap standardIcon,
                                            const QStyleOption *option,
                                            const QWidget *widget) const
{
#ifdef Q_OS_DARWIN
    Q_Q(const QCommonStyle);
    if (QGuiApplication::desktopSettingsAware()) {
        switch (standardIcon) {
        case QStyle::SP_DirIcon: {
            // A rather special case
            QIcon closeIcon = q->standardIcon(QStyle::SP_DirClosedIcon, option, widget);
            QIcon openIcon = q->standardIcon(QStyle::SP_DirOpenIcon, option, widget);
            closeIcon.addPixmap(openIcon.pixmap(16, 16), QIcon::Normal, QIcon::On);
            closeIcon.addPixmap(openIcon.pixmap(32, 32), QIcon::Normal, QIcon::On);
            closeIcon.addPixmap(openIcon.pixmap(64, 64), QIcon::Normal, QIcon::On);
            closeIcon.addPixmap(openIcon.pixmap(128, 128), QIcon::Normal, QIcon::On);
            return closeIcon;
        }

        case QStyle::SP_TitleBarNormalButton:
        case QStyle::SP_TitleBarCloseButton: {
            QIcon titleBarIcon;
            constexpr auto imagesPrefix = ":/qt-project.org/styles/macstyle/images/"_L1;
            const auto namePrefix = standardIcon == QStyle::SP_TitleBarCloseButton
                              ? "closedock-"_L1
                              : "dockdock-"_L1;
            for (const auto size : dockTitleIconSizes) {
                titleBarIcon.addFile(imagesPrefix + namePrefix + "macstyle-"_L1 + QString::number(size)
                                     + iconPngSuffix(), QSize(size, size), QIcon::Normal, QIcon::Off);
                titleBarIcon.addFile(imagesPrefix + namePrefix + "down-macstyle-"_L1 + QString::number(size)
                                     + iconPngSuffix(), QSize(size, size), QIcon::Normal, QIcon::On);
            }
            return titleBarIcon;
        }

        case QStyle::SP_MessageBoxQuestion:
        case QStyle::SP_MessageBoxInformation:
        case QStyle::SP_MessageBoxWarning:
        case QStyle::SP_MessageBoxCritical:
        case QStyle::SP_DesktopIcon:
        case QStyle::SP_TrashIcon:
        case QStyle::SP_ComputerIcon:
        case QStyle::SP_DriveFDIcon:
        case QStyle::SP_DriveHDIcon:
        case QStyle::SP_DriveCDIcon:
        case QStyle::SP_DriveDVDIcon:
        case QStyle::SP_DriveNetIcon:
        case QStyle::SP_DirOpenIcon:
        case QStyle::SP_DirClosedIcon:
        case QStyle::SP_DirLinkIcon:
        case QStyle::SP_FileLinkIcon:
        case QStyle::SP_FileIcon:
            if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
                QPlatformTheme::StandardPixmap sp = static_cast<QPlatformTheme::StandardPixmap>(standardIcon);
                QIcon retIcon;
                const QList<QSize> sizes = theme->themeHint(QPlatformTheme::IconPixmapSizes).value<QList<QSize> >();
                for (const QSize &size : sizes) {
                    QPixmap mainIcon;
                    const QString cacheKey = "qt_mac_constructQIconFromIconRef"_L1 + QString::number(standardIcon) + QString::number(size.width());
                    if (standardIcon >= QStyle::SP_CustomBase) {
                        mainIcon = theme->standardPixmap(sp, QSizeF(size));
                    } else if (QPixmapCache::find(cacheKey, &mainIcon) == false) {
                        mainIcon = theme->standardPixmap(sp, QSizeF(size));
                        QPixmapCache::insert(cacheKey, mainIcon);
                    }

                    retIcon.addPixmap(mainIcon);
                }
                return retIcon;
            }

        default:
            break;
        }
    } // if (QGuiApplication::desktopSettingsAware())
#else // Q_OS_DARWIN
    Q_UNUSED(standardIcon);
    Q_UNUSED(option);
    Q_UNUSED(widget);
#endif // Q_OS_DARWIN
    return {};
}